

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O2

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  int check_ambiguity;
  bool bVar2;
  int iVar3;
  int iVar4;
  custom_getopt_data *pcVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  char **ppcVar9;
  uint *prev_given;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  uint *field_given;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  uint uVar10;
  uint uVar11;
  option *poVar12;
  option *poVar13;
  custom_getopt_data *pcVar14;
  custom_getopt_data *pcVar15;
  char **possible_values;
  size_t sVar16;
  char *pcVar17;
  int iVar18;
  char cVar19;
  option *poVar20;
  char *pcVar21;
  cmdline_parser_arg_type arg_type;
  int iVar22;
  char *pcVar23;
  char short_opt;
  undefined4 in_stack_fffffffffffffd08;
  int iVar24;
  int local_2ec;
  gengetopt_args_info local_args_info;
  
  package_name = *argv;
  iVar4 = params->override;
  iVar1 = params->check_required;
  check_ambiguity = params->check_ambiguity;
  pcVar15 = (custom_getopt_data *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_args_info);
  pcVar5 = (custom_getopt_data *)(ulong)(uint)argc;
  pcVar17 = (char *)0x0;
  pcVar14 = (custom_getopt_data *)0x0;
  pcVar23 = extraout_RDX;
  iVar24 = params->print_errors;
LAB_0011f0dd:
  do {
    custom_opterr = iVar24;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (uint)pcVar14;
    uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    if (argc < 1) goto LAB_0011fa8b;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
    custom_optarg = pcVar17;
    iVar24 = custom_opterr;
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
       ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0011f167:
      if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      pcVar23 = (char *)CONCAT71((int7)((ulong)pcVar23 >> 8),
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
      }
      else {
        exchange(argv,pcVar15);
        pcVar23 = extraout_RDX_00;
      }
      pcVar14 = (custom_getopt_data *)
                (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      uVar10 = argc;
      if (argc < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
        uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      pcVar15 = pcVar5;
      if ((long)pcVar5 < (long)pcVar14) {
        pcVar15 = pcVar14;
      }
      for (; _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar10,
          (long)pcVar14 < (long)pcVar5;
          pcVar14 = (custom_getopt_data *)((long)&pcVar14->custom_optind + 1)) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = (uint)pcVar14;
        if ((*argv[(long)pcVar14] == '-') && (argv[(long)pcVar14][1] != '\0')) {
          pcVar15 = (custom_getopt_data *)((ulong)pcVar14 & 0xffffffff);
          break;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
      }
      uVar11 = argc;
      if ((((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == argc) ||
           (pcVar17 = argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7],
           uVar11 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7, *pcVar17 != '-')) ||
          (pcVar17[1] != '-')) || (pcVar17[2] != '\0')) {
        iVar18 = (int)pcVar15;
        if (iVar18 != argc) {
          lVar6 = (long)iVar18;
          pcVar17 = argv[lVar6];
          if ((*pcVar17 != '-') || (pcVar17[1] == '\0')) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar18 + 1;
            pcVar23 = (char *)0x1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar17;
            goto LAB_0011fc50;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               pcVar17 + (ulong)(pcVar17[1] == '-') + 1;
          goto LAB_0011f256;
        }
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
        uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          exchange(argv,pcVar15);
          pcVar23 = extraout_RDX_03;
          uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar10;
        pcVar14 = (custom_getopt_data *)(ulong)(uint)argc;
        uVar11 = argc;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = argc;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
      }
      uVar10 = (uint)pcVar14;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != uVar11) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      }
      goto LAB_0011fa8b;
    }
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
       (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_0011f167;
    lVar6 = (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    pcVar15 = (custom_getopt_data *)((ulong)pcVar14 & 0xffffffff);
LAB_0011f256:
    pcVar17 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    pcVar23 = argv[lVar6];
    uVar10 = (uint)pcVar15;
    if (pcVar23[1] == '-') {
      for (sVar16 = 0;
          (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar16] != '\0' &&
          (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar16] != '='));
          sVar16 = sVar16 + 1) {
      }
      bVar2 = false;
      local_2ec = -1;
      iVar18 = 0;
      poVar12 = (option *)0x0;
      for (poVar20 = cmdline_parser_internal::long_options; pcVar21 = poVar20->name,
          pcVar21 != (char *)0x0; poVar20 = poVar20 + 1) {
        iVar3 = strncmp(pcVar21,pcVar17,sVar16);
        poVar13 = poVar12;
        iVar22 = local_2ec;
        if (iVar3 == 0) {
          sVar8 = strlen(pcVar21);
          if ((int)sVar8 == (int)sVar16) goto LAB_0011f3cd;
          poVar13 = poVar20;
          iVar22 = iVar18;
          if ((poVar12 != (option *)0x0) &&
             (((poVar12->has_arg != poVar20->has_arg || (poVar12->flag != poVar20->flag)) ||
              (poVar13 = poVar12, iVar22 = local_2ec, poVar12->val != poVar20->val)))) {
            bVar2 = true;
            poVar13 = poVar12;
            iVar22 = local_2ec;
          }
        }
        local_2ec = iVar22;
        iVar18 = iVar18 + 1;
        poVar12 = poVar13;
      }
      if (bVar2) {
        if (iVar24 != 0) {
          fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar23);
          pcVar17 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        sVar16 = strlen(pcVar17);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar17 + sVar16;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
      }
      else {
        poVar20 = poVar12;
        iVar18 = local_2ec;
        if (poVar12 != (option *)0x0) {
LAB_0011f3cd:
          local_2ec = iVar18;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
          pcVar14 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          if (pcVar17[sVar16] == '\0') {
            if (poVar20->has_arg == 1) {
              if (argc <= (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                if (iVar24 != 0) {
                  fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar23);
                  pcVar17 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                }
                sVar16 = strlen(pcVar17);
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar17 + sVar16;
                goto LAB_0011fa32;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
              pcVar14 = (custom_getopt_data *)(ulong)(uVar10 + 2);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 2;
            }
          }
          else {
            if (poVar20->has_arg == 0) {
              if (iVar24 != 0) {
                if (pcVar23[1] == '-') {
                  fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                          poVar20->name);
                }
                else {
                  fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                          (ulong)(uint)(int)*pcVar23,poVar20->name);
                }
              }
              pcVar23 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              sVar16 = strlen(_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar23 + sVar16;
              goto LAB_0011fa32;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar17 + sVar16 + 1;
          }
          short_opt = '/';
          sVar16 = strlen(pcVar17);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar17 + sVar16;
          pcVar23 = (char *)(ulong)(uint)poVar20->val;
          if ((uint *)poVar20->flag == (uint *)0x0) goto LAB_0011f515;
          *poVar20->flag = poVar20->val;
          pcVar14 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          iVar24 = custom_opterr;
          goto LAB_0011f583;
        }
        if (iVar24 != 0) {
          fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar17);
          uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
      }
LAB_0011fa32:
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      goto LAB_0011fa40;
    }
    pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
    cVar19 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    pcVar23 = (char *)(ulong)(uint)(int)cVar19;
    short_opt = -0x50;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar21;
    pvVar7 = memchr("hVi:x:o:s:ev:t:",(int)cVar19,0x10);
    if (pcVar17[1] == '\0') {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
      pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    if ((pvVar7 == (void *)0x0) || (cVar19 == ':')) {
      if (iVar24 != 0) {
        fprintf(_stderr,"%s: invalid option -- %c\n",*argv,pcVar23);
      }
      goto LAB_0011fa32;
    }
    if (*(char *)((long)pvVar7 + 1) == ':') {
      if (*(char *)((long)pvVar7 + 2) == ':') {
        if (*pcVar21 == '\0') {
          pcVar21 = (char *)0x0;
        }
        else {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
          pcVar14 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
        goto LAB_0011f4b5;
      }
      if (*pcVar21 == '\0') {
        if (uVar10 == argc) {
          cVar19 = '?';
          if (iVar24 == 0) {
            iVar24 = 0;
          }
          else {
            short_opt = ' ';
            fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,pcVar23);
            pcVar14 = (custom_getopt_data *)
                      (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            iVar24 = custom_opterr;
          }
        }
        else {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
          pcVar14 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = argv[(int)uVar10];
        }
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
        pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
      }
      local_2ec = 0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      pcVar23 = (char *)(ulong)(uint)(int)cVar19;
    }
    else {
LAB_0011f4b5:
      local_2ec = 0;
    }
LAB_0011f515:
    pcVar17 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar18 = (int)pcVar23;
    switch(iVar18) {
    case 0x65:
      pcVar15 = (custom_getopt_data *)0x0;
      possible_values = (char **)0x0;
      pcVar23 = (char *)0x65;
      iVar18 = 0x1c6033;
      iVar22 = 1;
      arg_type = ARG_FLAG;
      prev_given = &local_args_info.elements_given;
      field_given = &args_info->elements_given;
      ppcVar9 = (char **)&args_info->elements_flag;
      goto LAB_0011f8e8;
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x77:
      goto switchD_0011f539_caseD_66;
    case 0x68:
      cmdline_parser_print_help();
LAB_0011fc85:
      cmdline_parser_free(&local_args_info);
      exit(0);
    case 0x69:
      iVar18 = args_info->input_file_group_counter;
      if (iVar18 != 0 && iVar4 != 0) {
        short_opt = -0x66;
        reset_group_input_file(args_info);
        iVar18 = args_info->input_file_group_counter;
      }
      args_info->input_file_group_counter = iVar18 + 1;
      pcVar23 = (char *)0x69;
      iVar18 = 0x1c6018;
      prev_given = &local_args_info.input_given;
      field_given = &args_info->input_given;
      pcVar15 = (custom_getopt_data *)&args_info->input_orig;
      ppcVar9 = &args_info->input_arg;
      break;
    case 0x6f:
      pcVar23 = (char *)0x6f;
      iVar18 = 0x1c6023;
      prev_given = &local_args_info.output_given;
      field_given = &args_info->output_given;
      pcVar15 = (custom_getopt_data *)&args_info->output_orig;
      ppcVar9 = &args_info->output_arg;
      break;
    case 0x73:
      pcVar23 = (char *)0x73;
      iVar18 = 0x1c602a;
      pcVar21 = "0.2";
      prev_given = &local_args_info.beadSize_given;
      field_given = &args_info->beadSize_given;
      pcVar15 = (custom_getopt_data *)&args_info->beadSize_orig;
      ppcVar9 = (char **)&args_info->beadSize_arg;
      goto LAB_0011f870;
    case 0x74:
      pcVar23 = (char *)0x74;
      iVar18 = 0x1c6046;
      pcVar21 = "300";
      prev_given = &local_args_info.temperature_given;
      field_given = &args_info->temperature_given;
      pcVar15 = (custom_getopt_data *)&args_info->temperature_orig;
      ppcVar9 = (char **)&args_info->temperature_arg;
      goto LAB_0011f870;
    case 0x76:
      pcVar23 = (char *)0x76;
      iVar18 = 0x1c603c;
      pcVar21 = "0.01";
      prev_given = &local_args_info.viscosity_given;
      field_given = &args_info->viscosity_given;
      pcVar15 = (custom_getopt_data *)&args_info->viscosity_orig;
      ppcVar9 = (char **)&args_info->viscosity_arg;
LAB_0011f870:
      iVar22 = 0;
      arg_type = ARG_DOUBLE;
      possible_values = (char **)0x0;
      goto LAB_0011f8ea;
    case 0x78:
      iVar18 = args_info->input_file_group_counter;
      if (iVar18 != 0 && iVar4 != 0) {
        short_opt = -0x66;
        reset_group_input_file(args_info);
        iVar18 = args_info->input_file_group_counter;
      }
      args_info->input_file_group_counter = iVar18 + 1;
      pcVar23 = (char *)0x78;
      iVar18 = 0x1c51d9;
      prev_given = &local_args_info.xyz_given;
      field_given = &args_info->xyz_given;
      pcVar15 = (custom_getopt_data *)&args_info->xyz_orig;
      ppcVar9 = &args_info->xyz_arg;
      break;
    default:
      if (iVar18 != 0) {
        uVar10 = (uint)pcVar14;
        if (iVar18 == -1) {
LAB_0011fa8b:
          uVar11 = args_info->input_file_group_counter;
          custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
          if (1 < (int)uVar11) {
            fprintf(_stderr,"%s: %d options of group input file were given. One is required%s.\n",
                    *argv,(ulong)uVar11,"");
            pcVar23 = extraout_RDX_04;
          }
          uVar11 = (uint)(1 < (int)uVar11);
          if (iVar1 != 0) {
            iVar4 = cmdline_parser_required2(args_info,*argv,pcVar23);
            uVar11 = uVar11 + iVar4;
          }
          cmdline_parser_release(&local_args_info);
          if (uVar11 != 0) {
            return 1;
          }
          uVar11 = argc - uVar10;
          if (uVar11 != 0 && (int)uVar10 <= argc) {
            args_info->inputs_num = uVar11;
            ppcVar9 = (char **)malloc((ulong)uVar11 << 3);
            args_info->inputs = ppcVar9;
            for (lVar6 = 0; (int)uVar10 + lVar6 < (long)argc; lVar6 = lVar6 + 1) {
              pcVar23 = gengetopt_strdup(argv[(int)uVar10 + lVar6]);
              args_info->inputs[lVar6] = pcVar23;
            }
            return 0;
          }
          return 0;
        }
        if (iVar18 != 0x3f) {
          if (iVar18 == 0x56) {
            cmdline_parser_print_version();
            goto LAB_0011fc85;
          }
switchD_0011f539_caseD_66:
LAB_0011fc50:
          custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
          fprintf(_stderr,"%s: option unknown: %c%s\n","Hydro",pcVar23,"");
          abort();
        }
        goto LAB_0011fa40;
      }
LAB_0011f583:
      pcVar17 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      pcVar23 = cmdline_parser_internal::long_options[local_2ec].name;
      short_opt = -0x5a;
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      iVar18 = strcmp(pcVar23,"stl");
      if (iVar18 == 0) {
        iVar18 = args_info->input_file_group_counter;
        if (iVar18 != 0 && iVar4 != 0) {
          short_opt = '<';
          reset_group_input_file(args_info);
          iVar18 = args_info->input_file_group_counter;
        }
        args_info->input_file_group_counter = iVar18 + 1;
        pcVar23 = (char *)0x2d;
        iVar18 = 0x1c51d4;
        prev_given = &local_args_info.stl_given;
        field_given = &args_info->stl_given;
        pcVar15 = (custom_getopt_data *)&args_info->stl_orig;
        ppcVar9 = &args_info->stl_arg;
        break;
      }
      short_opt = -0x47;
      iVar18 = strcmp(pcVar23,"msms");
      if (iVar18 != 0) {
        pcVar15 = (custom_getopt_data *)0x1c5c3b;
        short_opt = -0x30;
        iVar18 = strcmp(pcVar23,"model");
        pcVar23 = extraout_RDX_01;
        if (iVar18 == 0) {
          possible_values = cmdline_parser_model_values;
          pcVar23 = (char *)0x2d;
          iVar18 = 0x1c5c3b;
          iVar22 = 0;
          arg_type = ARG_ENUM;
          prev_given = &local_args_info.model_given;
          field_given = &args_info->model_given;
          pcVar15 = (custom_getopt_data *)&args_info->model_orig;
          ppcVar9 = (char **)&args_info->model_arg;
          goto LAB_0011f8e8;
        }
        goto LAB_0011f0dd;
      }
      iVar18 = args_info->input_file_group_counter;
      if (iVar18 != 0 && iVar4 != 0) {
        short_opt = -0x57;
        reset_group_input_file(args_info);
        iVar18 = args_info->input_file_group_counter;
      }
      args_info->input_file_group_counter = iVar18 + 1;
      pcVar23 = (char *)0x2d;
      iVar18 = 0x1c601e;
      prev_given = &local_args_info.msms_given;
      field_given = &args_info->msms_given;
      pcVar15 = (custom_getopt_data *)&args_info->msms_orig;
      ppcVar9 = &args_info->msms_arg;
    }
    possible_values = (char **)0x0;
    iVar22 = 0;
    arg_type = ARG_STRING;
LAB_0011f8e8:
    pcVar21 = (char *)0x0;
LAB_0011f8ea:
    iVar18 = update_arg(ppcVar9,(char **)pcVar15,field_given,prev_given,pcVar17,possible_values,
                        pcVar21,arg_type,check_ambiguity,iVar4,iVar22,iVar18,pcVar23,short_opt,
                        (char *)CONCAT44(iVar24,in_stack_fffffffffffffd08));
    pcVar23 = extraout_RDX_02;
    if (iVar18 != 0) {
LAB_0011fa40:
      cmdline_parser_release(&local_args_info);
      return 1;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "xyz",	1, NULL, 'x' },
        { "stl",	1, NULL, 0 },
        { "msms",	1, NULL, 0 },
        { "output",	1, NULL, 'o' },
        { "model",	1, NULL, 0 },
        { "beadSize",	1, NULL, 's' },
        { "elements",	0, NULL, 'e' },
        { "viscosity",	1, NULL, 'v' },
        { "temperature",	1, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:x:o:s:ev:t:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input MetaData (omd) file.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* xyz file for AtomicBead model.  */
        
          if (args_info->input_file_group_counter && override)
            reset_group_input_file (args_info);
          args_info->input_file_group_counter += 1;
        
          if (update_arg( (void *)&(args_info->xyz_arg), 
               &(args_info->xyz_orig), &(args_info->xyz_given),
              &(local_args_info.xyz_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "xyz", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file prefix.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 's':	/* bead size (diameter) for RoughShell model (in angstroms).  */
        
        
          if (update_arg( (void *)&(args_info->beadSize_arg), 
               &(args_info->beadSize_orig), &(args_info->beadSize_given),
              &(local_args_info.beadSize_given), optarg, 0, "0.2", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "beadSize", 's',
              additional_error))
            goto failure;
        
          break;
        case 'e':	/* output the hydrodynamic elements (beads or triangles) only, hydrodynamics calculation will not be performed.  */
        
        
          if (update_arg((void *)&(args_info->elements_flag), 0, &(args_info->elements_given),
              &(local_args_info.elements_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "elements", 'e',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* viscosity (in poise).  */
        
        
          if (update_arg( (void *)&(args_info->viscosity_arg), 
               &(args_info->viscosity_orig), &(args_info->viscosity_given),
              &(local_args_info.viscosity_given), optarg, 0, "0.01", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "viscosity", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* temperature (in Kelvin.  */
        
        
          if (update_arg( (void *)&(args_info->temperature_arg), 
               &(args_info->temperature_orig), &(args_info->temperature_given),
              &(local_args_info.temperature_given), optarg, 0, "300", ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "temperature", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* stl file for BoundaryElement model.  */
          if (strcmp (long_options[option_index].name, "stl") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->stl_arg), 
                 &(args_info->stl_orig), &(args_info->stl_given),
                &(local_args_info.stl_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "stl", '-',
                additional_error))
              goto failure;
          
          }
          /* filename root for MSMS .vert and .face files.  */
          else if (strcmp (long_options[option_index].name, "msms") == 0)
          {
          
            if (args_info->input_file_group_counter && override)
              reset_group_input_file (args_info);
            args_info->input_file_group_counter += 1;
          
            if (update_arg( (void *)&(args_info->msms_arg), 
                 &(args_info->msms_orig), &(args_info->msms_given),
                &(local_args_info.msms_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "msms", '-',
                additional_error))
              goto failure;
          
          }
          /* hydrodynamics model.  */
          else if (strcmp (long_options[option_index].name, "model") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->model_arg), 
                 &(args_info->model_orig), &(args_info->model_given),
                &(local_args_info.model_given), optarg, cmdline_parser_model_values, 0, ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "model", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->input_file_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group input file were given. One is required%s.\n", argv[0], args_info->input_file_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}